

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O1

void __thiscall Qentem::QTest::PrintGroupName(QTest *this)

{
  char *pcVar1;
  char *pcVar2;
  wostream *pwVar3;
  
  pcVar1 = TestOutPut::GetColor(TITLE);
  pcVar2 = TestOutPut::GetColor(END);
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar3 = (wostream *)&std::wcout;
  }
  else {
    pwVar3 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  }
  pwVar3 = std::operator<<(pwVar3,pcVar1);
  pwVar3 = std::operator<<(pwVar3,this->test_name_);
  pwVar3 = std::operator<<(pwVar3,pcVar2);
  std::operator<<(pwVar3,":\n");
  return;
}

Assistant:

QENTEM_NOINLINE void PrintGroupName() const {
        TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::TITLE), test_name_,
                          TestOutPut::GetColor(TestOutPut::Colors::END), ":\n");
    }